

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O1

void __thiscall reader_url_suite::test_path_abempty_one::test_method(test_path_abempty_one *this)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  view_type local_2e0;
  uint *local_2d0;
  undefined **local_2c8;
  undefined1 local_2c0;
  undefined8 *local_2b8;
  uint **local_2b0;
  view_type local_2a8;
  undefined8 *local_298;
  size_t *local_290;
  undefined1 local_288 [8];
  undefined8 local_280;
  shared_count sStack_278;
  undefined **local_270;
  undefined1 local_268;
  undefined8 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  url reader;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char input [26];
  
  local_2a8.ptr_ = input;
  builtin_strncpy(input + 0x10,".com/path",10);
  builtin_strncpy(input,"scheme://example",0x10);
  local_2a8.len_ = strlen(local_2a8.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_2a8);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x79);
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_00186260;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  local_2e0.len_ = (size_t)&local_2e0;
  local_2e0.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_2d0 = (uint *)((long)&local_2e0.ptr_ + 4);
  local_288[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token == scheme;
  local_2e0.ptr_._4_4_ = 2;
  local_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_248 = "";
  local_290 = &local_2e0.len_;
  local_2a8.len_ = local_2a8.len_ & 0xffffffffffffff00;
  local_2a8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = 0;
  local_2b0 = &local_2d0;
  local_2c8 = &PTR__lazy_ostream_00186618;
  local_2b8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x7a);
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_00186260;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 6) {
    iVar3 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,"scheme",6
                );
    local_288[0] = iVar3 == 0;
  }
  else {
    local_288[0] = false;
  }
  local_290 = &local_2e0.len_;
  local_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_248 = "";
  local_2e0.len_ = (size_t)&reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_2a8.len_ = local_2a8.len_ & 0xffffffffffffff00;
  local_2a8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = (uint *)0x16fe2f;
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_00186358;
  local_2b8 = &boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion
            (local_288,&local_270,&local_250,0x7a,2,2,2,"reader.literal()",&local_2a8,"\"scheme\"",
             &local_2c8);
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,0x7b);
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_00186260;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  local_288[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_2e0.ptr_._0_4_ = CONCAT31(local_2e0.ptr_._1_3_,local_288[0]);
  local_2e0.ptr_._4_4_ = CONCAT31(local_2e0.ptr_._5_3_,1);
  local_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_248 = "";
  local_2e0.len_ = (size_t)&local_2e0;
  local_2a8.len_ = local_2a8.len_ & 0xffffffffffffff00;
  local_2a8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2e0.len_;
  local_2d0 = (uint *)((long)&local_2e0.ptr_ + 4);
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_001865d8;
  local_2b8 = &boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion
            (local_288,&local_270,&local_250,0x7b,2,2,2,"reader.next()",&local_2a8,"true",&local_2c8
            );
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0x7c);
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_00186260;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  local_288[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 authority_host_name;
  local_2e0.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_2e0.ptr_._4_4_ = 4;
  local_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_248 = "";
  local_2e0.len_ = (size_t)&local_2e0;
  local_2a8.len_ = local_2a8.len_ & 0xffffffffffffff00;
  local_2a8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2e0.len_;
  local_2d0 = (uint *)((long)&local_2e0.ptr_ + 4);
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_00186618;
  local_2b8 = &boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion
            (local_288,&local_270,&local_250,0x7c,2,2,2,"reader.subcode()",&local_2a8,
             "url::token::subcode::authority_host_name",&local_2c8);
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x7d);
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_00186260;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 0xb) {
    iVar3 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,
                 "example.com",0xb);
    local_288[0] = iVar3 == 0;
  }
  else {
    local_288[0] = false;
  }
  local_290 = &local_2e0.len_;
  local_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_248 = "";
  local_2e0.len_ = (size_t)&reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_2a8.len_ = local_2a8.len_ & 0xffffffffffffff00;
  local_2a8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = (uint *)0x16f1f0;
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_00186458;
  local_2b8 = &boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion
            (local_288,&local_270,&local_250,0x7d,2,2,2,"reader.literal()",&local_2a8,
             "\"example.com\"",&local_2c8);
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x7e);
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_00186260;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  local_288[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_2e0.ptr_._0_4_ = CONCAT31(local_2e0.ptr_._1_3_,local_288[0]);
  local_2e0.ptr_._4_4_ = CONCAT31(local_2e0.ptr_._5_3_,1);
  local_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_248 = "";
  local_2e0.len_ = (size_t)&local_2e0;
  local_2a8.len_ = local_2a8.len_ & 0xffffffffffffff00;
  local_2a8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2e0.len_;
  local_2d0 = (uint *)((long)&local_2e0.ptr_ + 4);
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_001865d8;
  local_2b8 = &boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion
            (local_288,&local_270,&local_250,0x7e,2,2,2,"reader.next()",&local_2a8,"true",&local_2c8
            );
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x7f);
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_00186260;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  local_2e0.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::category
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_2e0.ptr_._4_4_ = 3;
  local_288[0] = (value)local_2e0.ptr_ == path;
  local_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_248 = "";
  local_2e0.len_ = (size_t)&local_2e0;
  local_2a8.len_ = local_2a8.len_ & 0xffffffffffffff00;
  local_2a8.ptr_ = (char *)&PTR__lazy_ostream_00186518;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2e0.len_;
  local_2d0 = (uint *)((long)&local_2e0.ptr_ + 4);
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_00186518;
  local_2b8 = &boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion
            (local_288,&local_270,&local_250,0x7f,2,2,2,"reader.category()",&local_2a8,
             "url::token::category::path",&local_2c8);
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x80);
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_00186260;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  local_2e0.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::code
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_2e0.ptr_._4_4_ = 6;
  local_288[0] = (value)local_2e0.ptr_ == path_segment;
  local_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_248 = "";
  local_2e0.len_ = (size_t)&local_2e0;
  local_2a8.len_ = local_2a8.len_ & 0xffffffffffffff00;
  local_2a8.ptr_ = (char *)&PTR__lazy_ostream_00186558;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2e0.len_;
  local_2d0 = (uint *)((long)&local_2e0.ptr_ + 4);
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_00186558;
  local_2b8 = &boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion
            (local_288,&local_270,&local_250,0x80,2,2,2,"reader.code()",&local_2a8,
             "url::token::code::path_segment",&local_2c8);
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x81);
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_00186260;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  local_288[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 path_segment;
  local_2e0.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_2e0.ptr_._4_4_ = 8;
  local_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_248 = "";
  local_2e0.len_ = (size_t)&local_2e0;
  local_2a8.len_ = local_2a8.len_ & 0xffffffffffffff00;
  local_2a8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2e0.len_;
  puVar1 = (uint *)((long)&local_2e0.ptr_ + 4);
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_00186618;
  local_2b8 = &boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d0;
  local_2d0 = puVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_288,&local_270,&local_250,0x81,2,2,2,"reader.subcode()",&local_2a8,
             "url::token::subcode::path_segment",&local_2c8);
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x82);
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_00186260;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 4) {
    iVar3 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,"path",4);
    local_288[0] = iVar3 == 0;
  }
  else {
    local_288[0] = false;
  }
  local_290 = &local_2e0.len_;
  local_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_248 = "";
  local_2e0.len_ = (size_t)&reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_2a8.len_ = local_2a8.len_ & 0xffffffffffffff00;
  local_2a8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = (uint *)0x16ffdb;
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_00186698;
  local_2b8 = &boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion
            (local_288,&local_270,&local_250,0x82,2,2,2,"reader.literal()",&local_2a8,"\"path\"",
             &local_2c8);
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1a0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x83);
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_00186260;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  bVar2 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_2e0.ptr_._0_4_ = CONCAT31(local_2e0.ptr_._1_3_,bVar2);
  local_2e0.ptr_._4_4_ = local_2e0.ptr_._4_4_ & 0xffffff00;
  local_288[0] = !bVar2;
  local_280 = 0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_248 = "";
  local_2e0.len_ = (size_t)&local_2e0;
  local_2a8.len_ = local_2a8.len_ & 0xffffffffffffff00;
  local_2a8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2e0.len_;
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_001865d8;
  local_2b8 = &boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d0;
  local_2d0 = puVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_288,&local_270,&local_250,0x83,2,2,2,"reader.next()",&local_2a8,"false",
             &local_2c8);
  boost::detail::shared_count::~shared_count(&sStack_278);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_abempty_one)
{
    const char input[] = "scheme://example.com/path";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_name);
    BOOST_REQUIRE_EQUAL(reader.literal(), "example.com");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}